

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *lang;
  cmSourceFile *this_local;
  
  lang = (char *)this;
  this_local = (cmSourceFile *)__return_storage_ptr__;
  pcVar1 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Language);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage() const
{
  // If the language was set explicitly by the user then use it.
  if (const char* lang = this->GetProperty(propLANGUAGE)) {
    return lang;
  }

  // If the language was determined from the source file extension use it.
  if (!this->Language.empty()) {
    return this->Language;
  }

  // The language is not known.
  return "";
}